

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

void xmlRegisterDefaultOutputCallbacks(void)

{
  xmlRegisterOutputCallbacks
            (xmlIODefaultMatch,(xmlOutputOpenCallback)0x0,(xmlOutputWriteCallback)0x0,
             (xmlOutputCloseCallback)0x0);
  return;
}

Assistant:

void
xmlRegisterDefaultOutputCallbacks (void) {
    xmlRegisterOutputCallbacks(xmlIODefaultMatch, NULL, NULL, NULL);
}